

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilderAsmJs.cpp
# Opt level: O1

SymOpnd * __thiscall
IRBuilderAsmJs::BuildFieldOpnd
          (IRBuilderAsmJs *this,RegSlot reg,PropertyId propertyId,PropertyKind propertyKind,
          IRType type,bool scale)

{
  PropertySym *sym;
  SymOpnd *pSVar1;
  undefined3 in_register_00000089;
  
  if (CONCAT31(in_register_00000089,scale) != 0) {
    propertyId = propertyId * TySize[type];
  }
  sym = BuildFieldSym(this,reg,propertyId,propertyKind);
  pSVar1 = IR::SymOpnd::New(&sym->super_Sym,type,this->m_func);
  return pSVar1;
}

Assistant:

IR::SymOpnd *
IRBuilderAsmJs::BuildFieldOpnd(Js::RegSlot reg, Js::PropertyId propertyId, PropertyKind propertyKind, IRType type, bool scale)
{
    Js::PropertyId scaledPropertyId = propertyId;
    if (scale)
    {
        scaledPropertyId *= TySize[type];
    }
    PropertySym * propertySym = BuildFieldSym(reg, scaledPropertyId, propertyKind);
    IR::SymOpnd * symOpnd = IR::SymOpnd::New(propertySym, type, m_func);

    return symOpnd;
}